

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_req_set_reader(Curl_easy *data,Curl_HttpReq httpreq,char **tep)

{
  char *pcVar1;
  byte bVar2;
  long offset;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLcode CVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  curl_off_t cVar10;
  curl_mimepart *pcVar11;
  size_t blen;
  
  if (((data->req).field_0xdb & 4) != 0) goto LAB_00133d73;
  if (3 < httpreq - HTTPREQ_POST) {
    (data->state).infilesize = 0;
    goto LAB_00133d73;
  }
  blen = (data->state).infilesize;
  switch(httpreq) {
  case HTTPREQ_POST:
    if (blen != 0) {
      pcVar9 = (char *)(data->set).postfields;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
        if ((pcVar9 != (char *)0x0) &&
           (_Var4 = Curl_compareheader(pcVar9,"Transfer-Encoding:",0x12,"chunked",7), _Var4)) {
          blen = 0xffffffffffffffff;
        }
        goto LAB_00133cff;
      }
      if (0 < (long)blen) {
        CVar5 = Curl_creader_set_buf(data,pcVar9,blen);
        goto LAB_00133d7e;
      }
    }
    break;
  case HTTPREQ_POST_FORM:
    if ((data->state).formp == (curl_mimepart *)0x0) {
      pcVar11 = (curl_mimepart *)(*Curl_ccalloc)(1,0x1b8);
      (data->state).formp = pcVar11;
      if (pcVar11 == (curl_mimepart *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      Curl_mime_cleanpart(pcVar11);
      CVar5 = Curl_getformdata(data,(data->state).formp,(data->set).httppost,
                               (data->state).fread_func);
      if (CVar5 != CURLE_OK) {
        (*Curl_cfree)((data->state).formp);
        (data->state).formp = (curl_mimepart *)0x0;
        return CVar5;
      }
      pcVar11 = (data->state).formp;
      (data->state).mimepost = pcVar11;
    }
    else {
      pcVar11 = (data->state).mimepost;
    }
    if (pcVar11 != (curl_mimepart *)0x0) goto LAB_00133d2a;
    CVar5 = Curl_creader_set_null(data);
    goto LAB_00134040;
  case HTTPREQ_POST_MIME:
    (data->state).mimepost = &(data->set).mimepost;
LAB_00133d2a:
    pcVar9 = Curl_checkheaders(data,"Content-Type",0xc);
    pcVar11 = (data->state).mimepost;
    pcVar11->flags = pcVar11->flags | 2;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)0x0;
      if (pcVar11->kind == MIMEKIND_MULTIPART) {
        pcVar9 = "multipart/form-data";
      }
    }
    else {
      pcVar8 = pcVar9 + 0xc;
      do {
        pcVar9 = pcVar8 + 1;
        pcVar1 = pcVar8 + 1;
        pcVar8 = pcVar9;
      } while (*pcVar1 == ' ');
    }
    CVar5 = CURLE_OK;
    curl_mime_headers(pcVar11,(data->set).headers,0);
    CVar6 = Curl_mime_prepare_headers
                      (data,(data->state).mimepost,pcVar9,(char *)0x0,MIMESTRATEGY_FORM);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    curl_mime_headers((data->state).mimepost,(curl_slist *)0x0,0);
    CVar6 = Curl_creader_set_mime(data,(data->state).mimepost);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
LAB_00134040:
    cVar10 = Curl_creader_total_length(data);
    (data->state).infilesize = cVar10;
    goto LAB_00133d7e;
  case HTTPREQ_PUT:
    if (blen != 0) {
LAB_00133cff:
      CVar5 = Curl_creader_set_fread(data,blen);
      goto LAB_00133d7e;
    }
  }
LAB_00133d73:
  CVar5 = Curl_creader_set_null(data);
LAB_00133d7e:
  if (CVar5 == CURLE_OK) {
    if ((httpreq == HTTPREQ_PUT) || (httpreq == HTTPREQ_POST)) {
      offset = (data->state).resume_from;
      if (offset != 0) {
        if (offset < 0) {
          (data->state).resume_from = 0;
        }
        else if ((((data->req).field_0xdb & 4) == 0) &&
                (CVar5 = Curl_creader_resume_from(data,offset), CVar5 != CURLE_OK)) {
          Curl_failf(data,"Unable to resume from offset %ld",(data->state).resume_from);
          return CVar5;
        }
      }
    }
    pcVar9 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
    if (pcVar9 == (char *)0x0) {
      cVar10 = Curl_creader_total_length(data);
      if (cVar10 < 0) {
        if ((((data->state).httpversion == '\n') || (bVar2 = data->conn->httpversion, bVar2 == 10))
           || ((data->state).httpwant == '\x01')) {
          Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
          return CURLE_UPLOAD_FAILED;
        }
        uVar7 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff | (uint)(bVar2 < 0x14) << 0xf;
      }
      else {
        uVar7 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
      }
      *(uint *)&(data->req).field_0xd9 = uVar7;
      CVar5 = CURLE_OK;
      if ((short)uVar7 < 0) {
        *tep = "Transfer-Encoding: chunked\r\n";
      }
    }
    else {
      _Var4 = Curl_compareheader(pcVar9,"Transfer-Encoding:",0x12,"chunked",7);
      uVar7 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
      *(uint *)&(data->req).field_0xd9 = (uint)_Var4 << 0xf | uVar7;
      CVar6 = CURLE_OK;
      CVar5 = CURLE_OK;
      if (((_Var4) && (CVar5 = CVar6, (data->state).httpversion != '\n')) &&
         ((bVar2 = data->conn->httpversion, bVar2 != 10 &&
          (0x13 < bVar2 && (data->state).httpwant != '\x01')))) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,
                     "suppressing chunked transfer encoding on connection using HTTP version 2 or higher"
                    );
          uVar7 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
        }
        *(uint *)&(data->req).field_0xd9 = uVar7;
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_http_req_set_reader(struct Curl_easy *data,
                                  Curl_HttpReq httpreq,
                                  const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;

  result = set_reader(data, httpreq);
  if(result)
    return result;

  result = http_resume(data, httpreq);
  if(result)
    return result;

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
    if(data->req.upload_chunky &&
       Curl_use_http_1_1plus(data, data->conn) &&
       (data->conn->httpversion >= 20)) {
       infof(data, "suppressing chunked transfer encoding on connection "
             "using HTTP version 2 or higher");
       data->req.upload_chunky = FALSE;
    }
  }
  else {
    curl_off_t req_clen = Curl_creader_total_length(data);

    if(req_clen < 0) {
      /* indeterminate request content length */
      if(Curl_use_http_1_1plus(data, data->conn)) {
        /* On HTTP/1.1, enable chunked, on HTTP/2 and later we do not
         * need it */
        data->req.upload_chunky = (data->conn->httpversion < 20);
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}